

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

uint16_t icu_63::writeFactorSuffix
                   (uint16_t *factors,uint16_t count,char *s,uint32_t code,uint16_t *indexes,
                   char **elementBases,char **elements,char *buffer,uint16_t bufferLength)

{
  char cVar1;
  ushort uVar2;
  uint16_t uVar3;
  char *pcVar4;
  ulong uVar5;
  uint16_t uVar6;
  short sVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar8 = (ulong)(count - 1 & 0xffff);
  uVar9 = uVar8;
  uVar5 = (ulong)code;
  while (uVar9 != 0) {
    uVar2 = factors[uVar9];
    indexes[uVar9] = (uint16_t)(uVar5 % (ulong)uVar2);
    uVar9 = uVar9 - 1;
    uVar5 = uVar5 / uVar2;
  }
  *indexes = (uint16_t)uVar5;
  uVar5 = 0;
  uVar3 = 0;
  while( true ) {
    if (elementBases == (char **)0x0) {
      elementBases = (char **)0x0;
    }
    else {
      *elementBases = s;
      elementBases = elementBases + 1;
    }
    uVar6 = indexes[uVar5];
    pcVar4 = s;
    while (bVar10 = uVar6 != 0, uVar6 = uVar6 - 1, bVar10) {
      do {
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
    }
    if (elements == (char **)0x0) {
      elements = (char **)0x0;
    }
    else {
      *elements = pcVar4;
      elements = elements + 1;
    }
    while( true ) {
      s = pcVar4 + 1;
      if (*pcVar4 == '\0') break;
      if (bufferLength == 0) {
        bufferLength = 0;
      }
      else {
        *buffer = *pcVar4;
        buffer = buffer + 1;
        bufferLength = bufferLength - 1;
      }
      uVar3 = uVar3 + 1;
      pcVar4 = s;
    }
    if (uVar5 == uVar8) break;
    sVar7 = ~indexes[uVar5] + factors[uVar5];
    while (bVar10 = sVar7 != 0, sVar7 = sVar7 + -1, bVar10) {
      do {
        cVar1 = *s;
        s = s + 1;
      } while (cVar1 != '\0');
    }
    uVar5 = uVar5 + 1;
  }
  if (bufferLength != 0) {
    *buffer = '\0';
  }
  return uVar3;
}

Assistant:

static uint16_t
writeFactorSuffix(const uint16_t *factors, uint16_t count,
                  const char *s, /* suffix elements */
                  uint32_t code,
                  uint16_t indexes[8], /* output fields from here */
                  const char *elementBases[8], const char *elements[8],
                  char *buffer, uint16_t bufferLength) {
    uint16_t i, factor, bufferPos=0;
    char c;

    /* write elements according to the factors */

    /*
     * the factorized elements are determined by modulo arithmetic
     * with the factors of this algorithm
     *
     * note that for fewer operations, count is decremented here
     */
    --count;
    for(i=count; i>0; --i) {
        factor=factors[i];
        indexes[i]=(uint16_t)(code%factor);
        code/=factor;
    }
    /*
     * we don't need to calculate the last modulus because start<=code<=end
     * guarantees here that code<=factors[0]
     */
    indexes[0]=(uint16_t)code;

    /* write each element */
    for(;;) {
        if(elementBases!=NULL) {
            *elementBases++=s;
        }

        /* skip indexes[i] strings */
        factor=indexes[i];
        while(factor>0) {
            while(*s++!=0) {}
            --factor;
        }
        if(elements!=NULL) {
            *elements++=s;
        }

        /* write element */
        while((c=*s++)!=0) {
            WRITE_CHAR(buffer, bufferLength, bufferPos, c);
        }

        /* we do not need to perform the rest of this loop for i==count - break here */
        if(i>=count) {
            break;
        }

        /* skip the rest of the strings for this factors[i] */
        factor=(uint16_t)(factors[i]-indexes[i]-1);
        while(factor>0) {
            while(*s++!=0) {}
            --factor;
        }

        ++i;
    }

    /* zero-terminate */
    if(bufferLength>0) {
        *buffer=0;
    }

    return bufferPos;
}